

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-metrics.c
# Opt level: O2

void metrics_routine_cb(void *arg)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  undefined8 uVar5;
  int64_t eval_b;
  int64_t eval_a;
  int cntr;
  uv_timer_t timer;
  uv_loop_t loop;
  
  timer.data = &cntr;
  cntr = 0;
  iVar1 = uv_loop_init(&loop);
  eval_a = (int64_t)iVar1;
  eval_b = 0;
  if (eval_a == 0) {
    iVar1 = uv_loop_configure(&loop,UV_METRICS_IDLE_TIME);
    eval_a = (int64_t)iVar1;
    eval_b = 0;
    if (eval_a == 0) {
      iVar1 = uv_timer_init(&loop,&timer);
      eval_a = (int64_t)iVar1;
      eval_b = 0;
      if (eval_a == 0) {
        iVar1 = uv_timer_start(&timer,timer_spin_cb,1000,0);
        eval_a = (int64_t)iVar1;
        eval_b = 0;
        if (eval_a == 0) {
          iVar1 = uv_run(&loop,UV_RUN_DEFAULT);
          eval_a = (int64_t)iVar1;
          eval_b = 0;
          if (eval_a == 0) {
            eval_a = (int64_t)cntr;
            eval_b = 0;
            if (eval_a < 1) {
              pcVar3 = ">";
              pcVar4 = "0";
              pcVar2 = "cntr";
              uVar5 = 0x60;
            }
            else {
              eval_a = uv_metrics_idle_time(&loop);
              eval_b = 500000000;
              if (eval_a < 500000000) {
                pcVar3 = ">=";
                pcVar4 = "(timeout - 500) * 1000000";
                pcVar2 = "idle_time";
                uVar5 = 0x68;
              }
              else {
                close_loop(&loop);
                iVar1 = uv_loop_close(&loop);
                eval_a = (int64_t)iVar1;
                eval_b = 0;
                if (eval_a == 0) {
                  return;
                }
                pcVar3 = "==";
                pcVar4 = "0";
                pcVar2 = "uv_loop_close(&loop)";
                uVar5 = 0x6b;
              }
            }
          }
          else {
            pcVar3 = "==";
            pcVar4 = "0";
            pcVar2 = "uv_run(&loop, UV_RUN_DEFAULT)";
            uVar5 = 0x5f;
          }
        }
        else {
          pcVar3 = "==";
          pcVar4 = "0";
          pcVar2 = "uv_timer_start(&timer, timer_spin_cb, timeout, 0)";
          uVar5 = 0x5d;
        }
      }
      else {
        pcVar3 = "==";
        pcVar4 = "0";
        pcVar2 = "uv_timer_init(&loop, &timer)";
        uVar5 = 0x5c;
      }
    }
    else {
      pcVar3 = "==";
      pcVar4 = "0";
      pcVar2 = "uv_loop_configure(&loop, UV_METRICS_IDLE_TIME)";
      uVar5 = 0x5b;
    }
  }
  else {
    pcVar3 = "==";
    pcVar4 = "0";
    pcVar2 = "uv_loop_init(&loop)";
    uVar5 = 0x5a;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-metrics.c"
          ,uVar5,pcVar2,pcVar3,pcVar4,eval_a,pcVar3,eval_b);
  abort();
}

Assistant:

static void metrics_routine_cb(void* arg) {
  const uint64_t timeout = 1000;
  uv_loop_t loop;
  uv_timer_t timer;
  uint64_t idle_time;
  int cntr;

  cntr = 0;
  timer.data = &cntr;

  ASSERT_OK(uv_loop_init(&loop));
  ASSERT_OK(uv_loop_configure(&loop, UV_METRICS_IDLE_TIME));
  ASSERT_OK(uv_timer_init(&loop, &timer));
  ASSERT_OK(uv_timer_start(&timer, timer_spin_cb, timeout, 0));

  ASSERT_OK(uv_run(&loop, UV_RUN_DEFAULT));
  ASSERT_GT(cntr, 0);

  idle_time = uv_metrics_idle_time(&loop);

  /* Only checking that idle time is greater than the lower bound since there
   * may have been thread contention, causing the event loop to be delayed in
   * the idle phase longer than expected.
   */
  ASSERT_GE(idle_time, (timeout - 500) * UV_NS_TO_MS);

  close_loop(&loop);
  ASSERT_OK(uv_loop_close(&loop));
}